

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled_light.hpp
# Opt level: O0

void * __thiscall
randomx::CompiledLightVm<randomx::AlignedAllocator<64ul>,true,true>::operator_new(size_t size)

{
  void *pvVar1;
  bad_alloc *this;
  void *ptr;
  size_t in_stack_fffffffffffffff0;
  
  pvVar1 = AlignedAllocator<64UL>::allocMemory(in_stack_fffffffffffffff0);
  if (pvVar1 == (void *)0x0) {
    this = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this);
    __cxa_throw(this,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return pvVar1;
}

Assistant:

void* operator new(size_t size) {
			void* ptr = AlignedAllocator<CacheLineSize>::allocMemory(size);
			if (ptr == nullptr)
				throw std::bad_alloc();
			return ptr;
		}